

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetPacket * enet_packet_create(void *data,size_t dataLength,enet_uint32 flags)

{
  ENetPacket *local_30;
  ENetPacket *packet;
  enet_uint32 flags_local;
  size_t dataLength_local;
  void *data_local;
  
  if ((flags & 4) == 0) {
    local_30 = (ENetPacket *)enet_malloc(dataLength + 0x30);
    if (local_30 == (ENetPacket *)0x0) {
      return (ENetPacket *)0x0;
    }
    local_30->data = (enet_uint8 *)(local_30 + 1);
    if (data != (void *)0x0) {
      memcpy(local_30->data,data,dataLength);
    }
  }
  else {
    local_30 = (ENetPacket *)enet_malloc(0x30);
    if (local_30 == (ENetPacket *)0x0) {
      return (ENetPacket *)0x0;
    }
    local_30->data = (enet_uint8 *)data;
  }
  local_30->referenceCount = 0;
  local_30->flags = flags;
  local_30->dataLength = dataLength;
  local_30->freeCallback = (ENetPacketFreeCallback)0x0;
  local_30->userData = (void *)0x0;
  return local_30;
}

Assistant:

ENetPacket *enet_packet_create(const void *data, size_t dataLength, enet_uint32 flags) {
        ENetPacket *packet;
        if (flags & ENET_PACKET_FLAG_NO_ALLOCATE) {
            packet = (ENetPacket *)enet_malloc(sizeof (ENetPacket));
            if (packet == NULL) {
                return NULL;
            }

            packet->data = (enet_uint8 *)data;
        }
        else {
            packet = (ENetPacket *)enet_malloc(sizeof (ENetPacket) + dataLength);
            if (packet == NULL) {
                return NULL;
            }

            packet->data = (enet_uint8 *)packet + sizeof(ENetPacket);

            if (data != NULL) {
                memcpy(packet->data, data, dataLength);
            }
        }

        packet->referenceCount = 0;
        packet->flags        = flags;
        packet->dataLength   = dataLength;
        packet->freeCallback = NULL;
        packet->userData     = NULL;

        return packet;
    }